

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidSqueeze1(void)

{
  RepeatedField<long> *pRVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  Tensor *pTVar13;
  void *pvVar14;
  LayerUnion LVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  Arena *pAVar19;
  uint uVar20;
  Model m;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar4 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018c552:
    pRVar18 = &(local_80.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar2 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0018c552;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar14 = pRVar4->elements[iVar2];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"A",puVar17);
  pFVar7 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = *(FeatureType **)((long)pvVar14 + 0x20);
    if (pFVar7 == (FeatureType *)0x0) {
      pAVar19 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (pAVar19);
      *(FeatureType **)((long)pvVar14 + 0x20) = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  uVar3 = (pAVar8->shape_).current_size_;
  if (uVar3 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar3] = 2;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar3] = 2;
  }
  uVar20 = uVar3 + 1;
  (pAVar8->shape_).current_size_ = uVar20;
  if (uVar20 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 2);
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar20] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar20] = 1;
  }
  uVar20 = uVar3 + 2;
  (pAVar8->shape_).current_size_ = uVar20;
  if (uVar20 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 3);
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar20] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar20] = 1;
  }
  pRVar1->current_size_ = uVar3 + 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar4 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018c76a:
    pRVar18 = &(local_80.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar2 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0018c76a;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar14 = pRVar4->elements[iVar2];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"B",puVar17);
  pFVar7 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  uVar3 = (pAVar8->shape_).current_size_;
  if (uVar3 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar3] = 2;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar3] = 2;
  }
  pRVar1->current_size_ = uVar3 + 1;
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar19);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018c8b5:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(local_80.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar11);
  }
  else {
    iVar2 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0018c8b5;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar2 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar2];
  }
  uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar11->name_,"squeeze",puVar17);
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018c910:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar2 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0018c910;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar14 = pRVar4->elements[iVar2];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3975b4);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018c960:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar2 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0018c960;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar14 = pRVar4->elements[iVar2];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3b5c76);
  pRVar4 = (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018c9b0:
    pTVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((pNVar11->inputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->inputtensor_).super_RepeatedPtrFieldBase,pTVar13);
  }
  else {
    iVar2 = (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0018c9b0;
    (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar14 = pRVar4->elements[iVar2];
  }
  *(undefined4 *)((long)pvVar14 + 0x24) = 3;
  pRVar4 = (pNVar11->outputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar2 = (pNVar11->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar4->allocated_size) {
      (pNVar11->outputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pvVar14 = pRVar4->elements[iVar2];
      goto LAB_0018ca03;
    }
  }
  pTVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                      ((pNVar11->outputtensor_).super_RepeatedPtrFieldBase.arena_);
  pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->outputtensor_).super_RepeatedPtrFieldBase,pTVar13);
LAB_0018ca03:
  *(undefined4 *)((long)pvVar14 + 0x24) = 1;
  if (pNVar11->_oneof_case_[0] == 0x460) {
    LVar15 = pNVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0x460;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    LVar15.squeeze_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SqueezeLayerParams>
                   (pAVar19);
    (pNVar11->layer_).squeeze_ = (SqueezeLayerParams *)LVar15;
  }
  pRVar1 = &(LVar15.reshape_)->targetshape_;
  uVar3 = ((RepeatedField<long> *)&(LVar15.convolution_)->kernelsize_)->current_size_;
  if (uVar3 == ((RepeatedField<long> *)&(LVar15.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar3] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar3] = 1;
  }
  uVar20 = uVar3 + 1;
  ((RepeatedField<long> *)&(LVar15.convolution_)->kernelsize_)->current_size_ = uVar20;
  if (uVar20 == ((RepeatedField<long> *)&(LVar15.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 2);
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar20] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar9[uVar20] = 1;
  }
  pRVar1->current_size_ = uVar3 + 2;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar6 = CoreML::Result::good(&local_50);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1340);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)bVar6;
}

Assistant:

int testInvalidSqueeze1() {
    /*
     A -> expand dims -> B
     shape of A: (2, 1, 1)
     shape of B: (2)
     axes parameter = [1,1]
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(2);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *shape_out = out->mutable_type()->mutable_multiarraytype();
    shape_out->add_shape(2);

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l = nn->add_layers();
    l->set_name("squeeze");
    l->add_input("A");
    l->add_output("B");
    l->add_inputtensor()->set_rank(3);
    l->add_outputtensor()->set_rank(1);
    auto *params = l->mutable_squeeze();
    params->add_axes(1);
    params->add_axes(1);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}